

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O0

Message * __thiscall
ki::protocol::dml::MessageManager::create_message
          (MessageManager *this,string *protocol_type,uint8_t message_type)

{
  MessageModule *this_00;
  ostream *poVar1;
  value_error *this_01;
  Message *pMVar2;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream oss;
  MessageModule *message_module;
  uint8_t message_type_local;
  string *protocol_type_local;
  MessageManager *this_local;
  
  this_00 = get_module(this,protocol_type);
  if (this_00 == (MessageModule *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"No service exists with protocol type: ");
    std::operator<<(poVar1,(string *)protocol_type);
    this_01 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    value_error::value_error(this_01,local_1d0,DML_INVALID_PROTOCOL_TYPE);
    __cxa_throw(this_01,&value_error::typeinfo,value_error::~value_error);
  }
  pMVar2 = MessageModule::create_message(this_00,message_type);
  return pMVar2;
}

Assistant:

Message *MessageManager::create_message(const std::string& protocol_type, uint8_t message_type) const
	{
		auto *message_module = get_module(protocol_type);
		if (!message_module)
		{
			std::ostringstream oss;
			oss << "No service exists with protocol type: " << protocol_type;
			throw value_error(oss.str(), value_error::DML_INVALID_PROTOCOL_TYPE);
		}

		return message_module->create_message(message_type);
	}